

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O0

void __thiscall
EasyUseSparseHashMap<HashObject<4,_4>,_int,_HashFn>::EasyUseSparseHashMap
          (EasyUseSparseHashMap<HashObject<4,_4>,_int,_HashFn> *this)

{
  allocator_type *in_RDI;
  key_type *in_stack_ffffffffffffffc8;
  libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_> *this_00;
  hasher *in_stack_ffffffffffffffe0;
  size_type in_stack_ffffffffffffffe8;
  sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
  *in_stack_fffffffffffffff0;
  
  this_00 = (libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_> *)
            &stack0xfffffffffffffff5;
  google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>::
  libc_allocator_with_realloc(this_00);
  google::
  sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
  ::sparse_hash_map(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                    (key_equal *)this_00,in_RDI);
  google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>::
  ~libc_allocator_with_realloc
            ((libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_> *)
             &stack0xfffffffffffffff5);
  HashObject<4,_4>::HashObject((HashObject<4,_4> *)&stack0xffffffffffffffe0,-1);
  google::
  sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
  ::set_deleted_key((sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                     *)in_RDI,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

EasyUseSparseHashMap() { this->set_deleted_key(-1); }